

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt5a.cpp
# Opt level: O1

bool __thiscall
crnlib::dxt5_endpoint_optimizer::compute(dxt5_endpoint_optimizer *this,params *p,results *r)

{
  uint *puVar1;
  uint *puVar2;
  byte bVar3;
  byte bVar4;
  uint8 *puVar5;
  uint32 **ppuVar6;
  uint32 *puVar7;
  results *prVar8;
  uchar *puVar9;
  size_t __n;
  long lVar10;
  uint32 *puVar11;
  uchar __tmp;
  int iVar12;
  uint uVar13;
  uint uVar14;
  params *ppVar15;
  ulong uVar16;
  uint low_endpoint;
  uint high_endpoint;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  
  this->m_pParams = p;
  this->m_pResults = r;
  if (p->m_num_pixels == 0) {
    return false;
  }
  if (p->m_pPixels == (color_quad_u8 *)0x0) {
    bVar22 = false;
  }
  else {
    if ((this->m_unique_values).m_size != 0) {
      (this->m_unique_values).m_size = 0;
    }
    if ((this->m_unique_value_weights).m_size != 0) {
      (this->m_unique_value_weights).m_size = 0;
    }
    memset(this->m_unique_value_map,0xff,0x400);
    __n = (size_t)p->m_num_pixels;
    if (p->m_num_pixels != 0) {
      uVar16 = 0;
      do {
        bVar3 = p->m_pPixels[uVar16].field_0.c[p->m_comp_index];
        uVar17 = this->m_unique_value_map[bVar3];
        if (uVar17 == 0xffffffff) {
          uVar17 = (this->m_unique_values).m_size;
          this->m_unique_value_map[bVar3] = uVar17;
          if ((this->m_unique_values).m_capacity <= uVar17) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&this->m_unique_values,uVar17 + 1,true,1,
                       (object_mover)0x0,false);
          }
          (this->m_unique_values).m_p[(this->m_unique_values).m_size] = bVar3;
          puVar1 = &(this->m_unique_values).m_size;
          *puVar1 = *puVar1 + 1;
          uVar13 = (this->m_unique_value_weights).m_size;
          if ((this->m_unique_value_weights).m_capacity <= uVar13) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&this->m_unique_value_weights,uVar13 + 1,true,4,
                       (object_mover)0x0,false);
          }
          (this->m_unique_value_weights).m_p[(this->m_unique_value_weights).m_size] = 0;
          puVar1 = &(this->m_unique_value_weights).m_size;
          *puVar1 = *puVar1 + 1;
        }
        puVar2 = (this->m_unique_value_weights).m_p + uVar17;
        *puVar2 = *puVar2 + 1;
        uVar16 = uVar16 + 1;
        __n = (size_t)p->m_num_pixels;
      } while (uVar16 < __n);
    }
    uVar17 = (this->m_unique_values).m_size;
    if (uVar17 == 1) {
      r->m_block_type = '\0';
      r->m_reordered = false;
      r->m_error = 0;
      puVar5 = (this->m_unique_values).m_p;
      r->m_first_endpoint = *puVar5;
      r->m_second_endpoint = *puVar5;
      memset(r->m_pSelectors,0,__n);
      bVar22 = true;
    }
    else {
      uVar13 = (this->m_trial_selectors).m_size;
      if (uVar13 != uVar17) {
        if (uVar13 <= uVar17) {
          if ((this->m_trial_selectors).m_capacity < uVar17) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&this->m_trial_selectors,uVar17,uVar13 + 1 == uVar17,1,
                       (object_mover)0x0,false);
          }
          uVar13 = (this->m_trial_selectors).m_size;
          memset((this->m_trial_selectors).m_p + uVar13,0,(ulong)(uVar17 - uVar13));
        }
        (this->m_trial_selectors).m_size = uVar17;
      }
      uVar17 = (this->m_unique_values).m_size;
      uVar13 = (this->m_best_selectors).m_size;
      if (uVar13 != uVar17) {
        if (uVar13 <= uVar17) {
          if ((this->m_best_selectors).m_capacity < uVar17) {
            elemental_vector::increase_capacity
                      ((elemental_vector *)&this->m_best_selectors,uVar17,uVar13 + 1 == uVar17,1,
                       (object_mover)0x0,false);
          }
          uVar13 = (this->m_best_selectors).m_size;
          memset((this->m_best_selectors).m_p + uVar13,0,(ulong)(uVar17 - uVar13));
        }
        (this->m_best_selectors).m_size = uVar17;
      }
      r->m_error = 0xffffffffffffffff;
      if ((this->m_unique_values).m_size != 1) {
        uVar19 = 1;
        uVar16 = 0;
        do {
          uVar21 = uVar16 + 1;
          if (uVar21 < (this->m_unique_values).m_size) {
            bVar3 = (this->m_unique_values).m_p[uVar16];
            uVar16 = uVar19;
            do {
              evaluate_solution(this,(uint)bVar3,(uint)(this->m_unique_values).m_p[uVar16]);
              uVar16 = uVar16 + 1;
            } while (uVar16 < (this->m_unique_values).m_size);
          }
          uVar19 = uVar19 + 1;
          uVar16 = uVar21;
        } while (uVar21 < (this->m_unique_values).m_size - 1);
      }
      if ((cCRNDXTQualityNormal < this->m_pParams->m_quality) && (this->m_pResults->m_error != 0)) {
        sparse_bit_array::resize(&this->m_flags,0x10000);
        sparse_bit_array::clear_all_bits(&this->m_flags);
        bVar22 = this->m_pParams->m_quality == cCRNDXTQualityUber;
        uVar13 = (uint)!bVar22 << 3 | 0xfffffff0;
        uVar17 = uVar13;
        do {
          low_endpoint = this->m_pResults->m_first_endpoint + uVar17;
          if ((int)low_endpoint < 0) {
            lVar10 = 0;
          }
          else {
            lVar10 = 0xe;
            if ((int)low_endpoint < 0x100) {
              uVar20 = uVar13;
              do {
                uVar18 = (uint)this->m_pResults->m_second_endpoint;
                high_endpoint = uVar20 + uVar18;
                if ((int)high_endpoint < 0) {
LAB_0017313b:
                  iVar12 = 0x13;
                }
                else {
                  iVar12 = 0x11;
                  if ((int)high_endpoint < 0x100) {
                    uVar18 = uVar18 + low_endpoint * 0x100 + uVar20;
                    ppuVar6 = (this->m_flags).m_ppGroups;
                    puVar11 = ppuVar6[uVar18 >> 9];
                    if ((puVar11 != (uint32 *)0x0) &&
                       ((*(uint *)((long)puVar11 + (ulong)(uVar18 >> 3 & 0x3c)) >>
                         (high_endpoint & 0x1f) & 1) != 0)) goto LAB_0017313b;
                    uVar14 = high_endpoint * 0x100 + low_endpoint;
                    puVar7 = ppuVar6[uVar14 >> 9];
                    if ((puVar7 == (uint32 *)0x0) ||
                       (iVar12 = 0x13,
                       (*(uint *)((long)puVar7 + (ulong)(uVar14 >> 3 & 0x3c)) &
                       1 << ((byte)low_endpoint & 0x1f)) == 0)) {
                      if (puVar11 == (uint32 *)0x0) {
                        puVar11 = (uint32 *)crnlib_malloc(0x40);
                        if (puVar11 == (uint32 *)0x0) {
                          crnlib_assert("p",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_sparse_bit_array.h"
                                        ,199);
                        }
                        puVar11[0xc] = 0;
                        puVar11[0xd] = 0;
                        puVar11[0xe] = 0;
                        puVar11[0xf] = 0;
                        puVar11[8] = 0;
                        puVar11[9] = 0;
                        puVar11[10] = 0;
                        puVar11[0xb] = 0;
                        puVar11[4] = 0;
                        puVar11[5] = 0;
                        puVar11[6] = 0;
                        puVar11[7] = 0;
                        puVar11[0] = 0;
                        puVar11[1] = 0;
                        puVar11[2] = 0;
                        puVar11[3] = 0;
                        (this->m_flags).m_ppGroups[uVar18 >> 9] = puVar11;
                      }
                      puVar2 = (uint *)((long)puVar11 + (ulong)(uVar18 >> 3 & 0x3c));
                      *puVar2 = *puVar2 | 1 << ((byte)high_endpoint & 0x1f);
                      evaluate_solution(this,low_endpoint,high_endpoint);
                      iVar12 = 0;
                    }
                  }
                }
                lVar10 = 0;
              } while (((iVar12 == 0x13) || (iVar12 == 0)) &&
                      (uVar20 = uVar20 + 1, (uint)bVar22 * 8 + 9 != uVar20));
            }
          }
        } while ((lVar10 == 0) &&
                (bVar23 = uVar17 != (uint)bVar22 * 8 + 8, uVar17 = uVar17 + 1, bVar23));
      }
      prVar8 = this->m_pResults;
      prVar8->m_reordered = false;
      bVar3 = prVar8->m_first_endpoint;
      bVar4 = prVar8->m_second_endpoint;
      if (bVar3 == bVar4) {
        if ((this->m_best_selectors).m_size != 0) {
          uVar16 = 0;
          do {
            (this->m_best_selectors).m_p[uVar16] = '\0';
            uVar16 = uVar16 + 1;
          } while (uVar16 < (this->m_best_selectors).m_size);
        }
      }
      else if (prVar8->m_block_type == '\0') {
        if (bVar3 <= bVar4) {
          prVar8->m_first_endpoint = bVar4;
          prVar8->m_second_endpoint = bVar3;
          this->m_pResults->m_reordered = true;
          if ((this->m_best_selectors).m_size != 0) {
            uVar16 = 0;
            do {
              puVar9 = (this->m_best_selectors).m_p;
              puVar9[uVar16] = *(uchar *)((long)&g_eight_alpha_invert_table + (ulong)puVar9[uVar16])
              ;
              uVar16 = uVar16 + 1;
            } while (uVar16 < (this->m_best_selectors).m_size);
          }
        }
      }
      else if (bVar4 < bVar3) {
        prVar8->m_first_endpoint = bVar4;
        prVar8->m_second_endpoint = bVar3;
        this->m_pResults->m_reordered = true;
        if ((this->m_best_selectors).m_size != 0) {
          uVar16 = 0;
          do {
            puVar9 = (this->m_best_selectors).m_p;
            puVar9[uVar16] = *(uchar *)((long)&g_six_alpha_invert_table + (ulong)puVar9[uVar16]);
            uVar16 = uVar16 + 1;
          } while (uVar16 < (this->m_best_selectors).m_size);
        }
      }
      ppVar15 = this->m_pParams;
      bVar22 = true;
      if (ppVar15->m_num_pixels != 0) {
        uVar16 = 0;
        do {
          this->m_pResults->m_pSelectors[uVar16] =
               (this->m_best_selectors).m_p
               [(uint)this->m_unique_value_map
                      [ppVar15->m_pPixels[uVar16].field_0.c[ppVar15->m_comp_index]]];
          uVar16 = uVar16 + 1;
          ppVar15 = this->m_pParams;
        } while (uVar16 < ppVar15->m_num_pixels);
      }
    }
  }
  return bVar22;
}

Assistant:

bool dxt5_endpoint_optimizer::compute(const params& p, results& r)
    {
        m_pParams = &p;
        m_pResults = &r;

        if ((!p.m_num_pixels) || (!p.m_pPixels))
        {
            return false;
        }

        m_unique_values.resize(0);
        m_unique_value_weights.resize(0);

        for (uint i = 0; i < 256; i++)
        {
            m_unique_value_map[i] = -1;
        }

        for (uint i = 0; i < p.m_num_pixels; i++)
        {
            uint alpha = p.m_pPixels[i][p.m_comp_index];

            int index = m_unique_value_map[alpha];

            if (index == -1)
            {
                index = m_unique_values.size();

                m_unique_value_map[alpha] = index;

                m_unique_values.push_back(static_cast<uint8>(alpha));
                m_unique_value_weights.push_back(0);
            }

            m_unique_value_weights[index]++;
        }

        if (m_unique_values.size() == 1)
        {
            r.m_block_type = 0;
            r.m_reordered = false;
            r.m_error = 0;
            r.m_first_endpoint = m_unique_values[0];
            r.m_second_endpoint = m_unique_values[0];
            memset(r.m_pSelectors, 0, p.m_num_pixels);
            return true;
        }

        m_trial_selectors.resize(m_unique_values.size());
        m_best_selectors.resize(m_unique_values.size());

        r.m_error = cUINT64_MAX;

        for (uint i = 0; i < m_unique_values.size() - 1; i++)
        {
            const uint low_endpoint = m_unique_values[i];

            for (uint j = i + 1; j < m_unique_values.size(); j++)
            {
                const uint high_endpoint = m_unique_values[j];

                evaluate_solution(low_endpoint, high_endpoint);
            }
        }

        if ((m_pParams->m_quality >= cCRNDXTQualityBetter) && (m_pResults->m_error))
        {
            m_flags.resize(256 * 256);
            m_flags.clear_all_bits();

            const int cProbeAmount = (m_pParams->m_quality == cCRNDXTQualityUber) ? 16 : 8;

            for (int l_delta = -cProbeAmount; l_delta <= cProbeAmount; l_delta++)
            {
                const int l = m_pResults->m_first_endpoint + l_delta;
                if (l < 0)
                {
                    continue;
                }
                else if (l > 255)
                {
                    break;
                }
                const uint bit_index = l * 256;

                for (int h_delta = -cProbeAmount; h_delta <= cProbeAmount; h_delta++)
                {
                    const int h = m_pResults->m_second_endpoint + h_delta;
                    if (h < 0)
                    {
                        continue;
                    }
                    else if (h > 255)
                    {
                        break;
                    }

                    //if (m_flags.get_bit(bit_index + h))
                    //   continue;
                    if ((m_flags.get_bit(bit_index + h)) || (m_flags.get_bit(h * 256 + l)))
                    {
                        continue;
                    }

                    m_flags.set_bit(bit_index + h);

                    evaluate_solution(static_cast<uint>(l), static_cast<uint>(h));
                }
            }
        }

        m_pResults->m_reordered = false;
        if (m_pResults->m_first_endpoint == m_pResults->m_second_endpoint)
        {
            for (uint i = 0; i < m_best_selectors.size(); i++)
            {
                m_best_selectors[i] = 0;
            }
        }
        else if (m_pResults->m_block_type)
        {
            //if (l > h)
            //   eight alpha
            // else
            //   six alpha

            if (m_pResults->m_first_endpoint > m_pResults->m_second_endpoint)
            {
                std::swap(m_pResults->m_first_endpoint, m_pResults->m_second_endpoint);
                m_pResults->m_reordered = true;
                for (uint i = 0; i < m_best_selectors.size(); i++)
                {
                    m_best_selectors[i] = g_six_alpha_invert_table[m_best_selectors[i]];
                }
            }
        }
        else if (m_pResults->m_first_endpoint <= m_pResults->m_second_endpoint)
        {
            std::swap(m_pResults->m_first_endpoint, m_pResults->m_second_endpoint);
            m_pResults->m_reordered = true;
            for (uint i = 0; i < m_best_selectors.size(); i++)
            {
                m_best_selectors[i] = g_eight_alpha_invert_table[m_best_selectors[i]];
            }
        }

        for (uint i = 0; i < m_pParams->m_num_pixels; i++)
        {
            uint alpha = m_pParams->m_pPixels[i][m_pParams->m_comp_index];

            int index = m_unique_value_map[alpha];

            m_pResults->m_pSelectors[i] = m_best_selectors[index];
        }

        return true;
    }